

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

void __thiscall cmCTestBuildHandler::GenerateXMLLaunched(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  pointer pcVar1;
  bool bVar2;
  unsigned_long uVar3;
  char *fname;
  long *plVar4;
  _Rb_tree_node_base *p_Var5;
  size_type *psVar6;
  int iVar7;
  cmCTestBuildHandler *this_00;
  unsigned_long dindex;
  __string_type __str;
  Directory launchDir;
  Fragments fragments;
  cmFileTimeCache ftc;
  long *local_f0;
  ulong local_e8;
  long local_e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  cmFileTimeCache local_68;
  
  if ((this->CTestLaunchDir)._M_string_length != 0) {
    local_b0._16_8_ = xml;
    cmFileTimeCache::cmFileTimeCache(&local_68);
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar7 = this->MaxErrors;
    local_b0._12_4_ = this->MaxWarnings;
    local_98._M_impl.super__Rb_tree_key_compare<cmCTestBuildHandler::FragmentCompare>._M_key_compare
    .FTC = (FragmentCompare)(FragmentCompare)&local_68;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    cmsys::Directory::Directory((Directory *)local_b0);
    cmsys::Directory::Load((Directory *)local_b0,&this->CTestLaunchDir,(string *)0x0);
    uVar3 = cmsys::Directory::GetNumberOfFiles((Directory *)local_b0);
    p_Var5 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    if (uVar3 != 0) {
      dindex = 0;
      do {
        this_00 = (cmCTestBuildHandler *)local_b0;
        fname = cmsys::Directory::GetFile((Directory *)this_00,dindex);
        bVar2 = IsLaunchedErrorFile(this_00,fname);
        if (bVar2 && iVar7 != 0) {
          local_f0 = local_e0;
          pcVar1 = (this->CTestLaunchDir)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,pcVar1,pcVar1 + (this->CTestLaunchDir)._M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_f0,local_e8,0,'\x01');
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          psVar6 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar6) {
            local_d0.field_2._M_allocated_capacity = *psVar6;
            local_d0.field_2._8_8_ = plVar4[3];
          }
          else {
            local_d0.field_2._M_allocated_capacity = *psVar6;
            local_d0._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_d0._M_string_length = plVar4[1];
          *plVar4 = (long)psVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
                      *)&local_98,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if (local_f0 != local_e0) {
            operator_delete(local_f0,local_e0[0] + 1);
          }
          iVar7 = iVar7 + -1;
          this->TotalErrors = this->TotalErrors + 1;
        }
        else {
          bVar2 = IsLaunchedWarningFile(this_00,fname);
          if (bVar2 && local_b0._12_4_ != 0) {
            local_f0 = local_e0;
            pcVar1 = (this->CTestLaunchDir)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar1,pcVar1 + (this->CTestLaunchDir)._M_string_length);
            std::__cxx11::string::_M_replace_aux((ulong)&local_f0,local_e8,0,'\x01');
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            psVar6 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_d0.field_2._M_allocated_capacity = *psVar6;
              local_d0.field_2._8_8_ = plVar4[3];
            }
            else {
              local_d0.field_2._M_allocated_capacity = *psVar6;
              local_d0._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_d0._M_string_length = plVar4[1];
            *plVar4 = (long)psVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,cmCTestBuildHandler::FragmentCompare,std::allocator<std::__cxx11::string>>
                        *)&local_98,&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if (local_f0 != local_e0) {
              operator_delete(local_f0,local_e0[0] + 1);
            }
            local_b0._12_4_ = local_b0._12_4_ + -1;
            this->TotalWarnings = this->TotalWarnings + 1;
          }
        }
        dindex = dindex + 1;
        p_Var5 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
      } while (uVar3 != dindex);
    }
    for (; (_Rb_tree_header *)p_Var5 != &local_98._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      cmXMLWriter::FragmentFile((cmXMLWriter *)local_b0._16_8_,*(char **)(p_Var5 + 1));
    }
    cmsys::Directory::~Directory((Directory *)local_b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_98);
    cmFileTimeCache::~cmFileTimeCache(&local_68);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLaunched(cmXMLWriter& xml)
{
  if (this->CTestLaunchDir.empty()) {
    return;
  }

  // Sort XML fragments in chronological order.
  cmFileTimeCache ftc;
  FragmentCompare fragmentCompare(&ftc);
  using Fragments = std::set<std::string, FragmentCompare>;
  Fragments fragments(fragmentCompare);

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  // Identify fragments on disk.
  cmsys::Directory launchDir;
  launchDir.Load(this->CTestLaunchDir);
  unsigned long n = launchDir.GetNumberOfFiles();
  for (unsigned long i = 0; i < n; ++i) {
    const char* fname = launchDir.GetFile(i);
    if (this->IsLaunchedErrorFile(fname) && numErrorsAllowed) {
      numErrorsAllowed--;
      fragments.insert(this->CTestLaunchDir + '/' + fname);
      ++this->TotalErrors;
    } else if (this->IsLaunchedWarningFile(fname) && numWarningsAllowed) {
      numWarningsAllowed--;
      fragments.insert(this->CTestLaunchDir + '/' + fname);
      ++this->TotalWarnings;
    }
  }

  // Copy the fragments into the final XML file.
  for (std::string const& f : fragments) {
    xml.FragmentFile(f.c_str());
  }
}